

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MultiFab::norm1
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MultiFab *this,
          Vector<int,_std::allocator<int>_> *comps,int ngrow,bool local)

{
  pointer piVar1;
  pointer piVar2;
  int *piVar3;
  Real in_RAX;
  int *piVar4;
  Real local_38;
  
  piVar1 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  piVar2 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,
             (long)(int)((ulong)((long)piVar1 - (long)piVar2) >> 2));
  piVar3 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar4 = (comps->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar3; piVar4 = piVar4 + 1) {
    local_38 = norm1(this,*piVar4,ngrow,false);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MultiFab::norm1 (const Vector<int>& comps, int ngrow, bool local) const
{
    BL_ASSERT(ixType().cellCentered());

    int n = comps.size();
    Vector<Real> nm1;
    nm1.reserve(n);

    for (int comp : comps) {
        nm1.push_back(this->norm1(comp, ngrow, true));
    }

    if (!local)
        ParallelAllReduce::Sum(nm1.dataPtr(), n, ParallelContext::CommunicatorSub());

    return nm1;
}